

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase32(optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *__return_storage_ptr__,string_view str)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  bool bVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uchar local_39;
  long local_38;
  
  pbVar6 = (byte *)str._M_str;
  uVar3 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])str & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (uVar3 != 0) {
      uVar3 = uVar3 - (pbVar6[uVar3 - 1] == 0x3d);
    }
    if ((1 < uVar3) && (*(short *)(pbVar6 + (uVar3 - 2)) == 0x3d3d)) {
      uVar3 = uVar3 - 2;
    }
    if (uVar3 != 0) {
      uVar3 = uVar3 - (pbVar6[uVar3 - 1] == 0x3d);
    }
    if ((1 < uVar3) && (*(short *)(pbVar6 + (uVar3 - 2)) == 0x3d3d)) {
      uVar3 = uVar3 - 2;
    }
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_58,uVar3 * 5 >> 3);
    pbVar4 = pbVar6 + uVar3;
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (pbVar6 == pbVar4) {
        if ((uVar3 < 5) && ((uVar2 << (8U - (char)uVar3 & 0x3f) & 0xfe) == 0)) {
          *(pointer *)
           &(__return_storage_ptr__->
            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) =
               local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10)
               = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar7 = true;
          goto LAB_00404f4e;
        }
        break;
      }
      cVar1 = DecodeBase32::decode32_table[*pbVar6];
      if (-1 < (long)cVar1) {
        uVar2 = (ulong)(((uint)uVar2 & 0x7f) << 5) | (long)cVar1;
        uVar5 = uVar3 + 5;
        bVar7 = 2 < uVar3;
        uVar3 = uVar5;
        if (bVar7) {
          do {
            uVar5 = uVar5 - 8;
            local_39 = (uchar)(uVar2 >> ((byte)uVar5 & 0x3f));
            if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                         (iterator)
                         local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_39);
            }
            else {
              *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish = local_39;
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar3 = uVar5;
          } while (7 < uVar5);
        }
        pbVar6 = pbVar6 + 1;
      }
    } while (-1 < cVar1);
    bVar7 = false;
LAB_00404f4e:
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = bVar7;
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase32(std::string_view str)
{
    static const int8_t decode32_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, 26, 27, 28, 29, 30, 31, -1, -1, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1,  0,  1,  2,
         3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22,
        23, 24, 25, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 8 != 0) return {};
    /* 1, 3, 4, or 6 padding '=' suffix characters are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 5) / 8);
    bool valid = ConvertBits<5, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode32_table[uint8_t(c)]; }
    );

    if (!valid) return {};

    return ret;
}